

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitSum(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *this,SumExpr e)

{
  Impl **ppIVar1;
  int iVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> e_00;
  bool bVar3;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_38;
  
  value.size_ = 1;
  value.data_ = "(";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  local_38.ptr_ =
       (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                       impl_ + 8);
  iVar2 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  if ((long)iVar2 != 0) {
    while( true ) {
      e_00 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
             operator*(&local_38);
      Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,-1);
      ppIVar1 = local_38.ptr_ + 1;
      bVar3 = local_38.ptr_ ==
              (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                              super_ExprBase.impl_ + (long)iVar2 * 8);
      local_38.ptr_ = ppIVar1;
      if (bVar3) break;
      value_00.size_ = 3;
      value_00.data_ = " + ";
      fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
    }
  }
  fmt::BasicWriter<char>::operator<<(this->writer_,')');
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitSum(SumExpr e) {
  writer_ << "(";
  typename SumExpr::iterator i = e.begin(), end = e.end();
  if (i != end) {
    Visit(*i);
    for (++i; i != end; ++i) {
      writer_ << " + ";
      Visit(*i);
    }
  }
  writer_ << ')';
}